

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O1

void bn_reverse(uchar *s,int len)

{
  uchar uVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  
  if (1 < len) {
    lVar4 = 0;
    lVar3 = (ulong)(uint)len - 2;
    do {
      uVar1 = s[lVar4];
      s[lVar4] = s[lVar3 + 1];
      s[lVar3 + 1] = uVar1;
      lVar4 = lVar4 + 1;
      bVar2 = lVar4 < lVar3;
      lVar3 = lVar3 + -1;
    } while (bVar2);
  }
  return;
}

Assistant:

void bn_reverse (unsigned char *s, int len)
{
  int     ix, iy;
  unsigned char t;

  ix = 0;
  iy = len - 1;
  while (ix < iy) {
    t     = s[ix];
    s[ix] = s[iy];
    s[iy] = t;
    ++ix;
    --iy;
  }
}